

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UDPSender.hpp
# Opt level: O2

void __thiscall Statsd::UDPSender::sendToDaemon(UDPSender *this,string *message)

{
  ssize_t sVar1;
  int *piVar2;
  string local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  sVar1 = sendto(this->m_socket,(message->_M_dataplus)._M_p,message->_M_string_length,0,
                 (sockaddr *)&this->m_server,0x10);
  if (sVar1 == -1) {
    std::operator+(&local_b0,"sendto server failed: host=",&this->m_host);
    std::operator+(&local_90,&local_b0,":");
    std::__cxx11::to_string(&local_d0,(uint)this->m_port);
    std::operator+(&local_70,&local_90,&local_d0);
    std::operator+(&local_50,&local_70,", err=");
    piVar2 = __errno_location();
    std::__cxx11::to_string(&local_f0,*piVar2);
    std::operator+(&local_30,&local_50,&local_f0);
    std::__cxx11::string::operator=((string *)&this->m_errorMessage,(string *)&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  return;
}

Assistant:

inline void UDPSender::sendToDaemon(const std::string& message) noexcept {
    // Try sending the message
    const auto ret = sendto(m_socket,
                            message.data(),
#ifdef _WIN32
                            static_cast<int>(message.size()),
#else
                            message.size(),
#endif
                            0,
                            (struct sockaddr*)&m_server,
                            sizeof(m_server));
    if (ret == -1) {
        m_errorMessage = "sendto server failed: host=" + m_host + ":" +
                         std::to_string(static_cast<unsigned int>(m_port)) + ", err=" + std::to_string(SOCKET_ERRNO);
    }
}